

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,float,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  FloatFormat *fmt;
  float fVar1;
  pointer pVVar2;
  Variable<tcu::Vector<float,_2>_> *pVVar3;
  pointer pcVar4;
  Variable<float> *pVVar5;
  double dVar6;
  PrecisionCase *pPVar7;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar8;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pIVar9;
  undefined8 uVar10;
  bool bVar11;
  ContextType type;
  int iVar12;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  char *__s;
  size_t sVar15;
  long *plVar16;
  ShaderExecutor *pSVar17;
  IVal *pIVar18;
  IVal *pIVar19;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  Vector<float,_2> *pVVar21;
  long lVar22;
  PrecisionCase *pPVar23;
  size_t size;
  ulong uVar24;
  long lVar25;
  FuncSet funcs;
  IVal reference1;
  ostringstream os;
  IVal in3;
  Environment env;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_4e8 [8];
  PrecisionCase *local_4e0;
  undefined1 local_4d8 [8];
  double local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4c8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4b8;
  undefined1 local_4b0 [8];
  undefined8 uStack_4a8;
  undefined1 auStack_4a0 [24];
  double dStack_488;
  IVal local_479;
  pointer local_478;
  Statement *local_470;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_468;
  size_t local_460;
  undefined1 local_458 [8];
  double dStack_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_448;
  double local_438;
  Data DStack_430;
  undefined4 local_420;
  ios_base local_3e8 [8];
  ios_base local_3e0 [264];
  string local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2b8;
  ulong local_288;
  ResultCollector *local_280;
  FloatFormat local_278;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [32];
  double local_188;
  anon_struct_8_2_bfd9d0cb_for_basic aStack_180;
  ios_base local_138 [264];
  
  local_478 = (inputs->in0).
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  size = (long)pVVar2 - (long)local_478 >> 3;
  local_4b8 = variables;
  local_470 = stmt;
  local_468 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_250,size);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_278.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_278.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_278.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_278.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_278.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_278.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_278.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_278.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_278._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b8._M_impl.super__Rb_tree_header._M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_458 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"Statement: ",0xb);
  (*local_470->_vptr_Statement[2])(local_470,(ostringstream *)&dStack_450);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4e0 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_450);
  std::ios_base::~ios_base(local_3e0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uStack_4a8 = (double)((ulong)uStack_4a8._4_4_ << 0x20);
  auStack_4a0._0_4_ = 0.0;
  auStack_4a0._4_4_ = 0.0;
  dStack_488 = 0.0;
  auStack_4a0._8_8_ = (_Rb_tree_node_base *)&uStack_4a8;
  auStack_4a0._16_8_ = (_Rb_tree_node_base *)&uStack_4a8;
  (*local_470->_vptr_Statement[4])(local_470,local_4b0);
  if ((_Rb_tree_node_base *)auStack_4a0._8_8_ != (_Rb_tree_node_base *)&uStack_4a8) {
    p_Var14 = (_Rb_tree_node_base *)auStack_4a0._8_8_;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_1a8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != (_Rb_tree_node_base *)&uStack_4a8);
  }
  pPVar23 = local_4e0;
  if (dStack_488 != 0.0) {
    local_458 = (undefined1  [8])((local_4e0->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_450,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_450,(char *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_),
               (long)local_4d0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_) != &aStack_4c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_),
                      aStack_4c8._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_450);
    std::ios_base::~ios_base(local_3e0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"precision ",10);
  __s = glu::getPrecisionName((pPVar23->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_4e8 + *(long *)((long)local_458 + -0x18)) + 0x90);
  }
  else {
    sVar15 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,__s,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar4 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar4) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
  std::ios_base::~ios_base(local_3e8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_4e0->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_4e0->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_4e0->m_extension);
    plVar16 = (long *)std::__cxx11::string::append(local_1a8);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar20) {
      aStack_448._M_allocated_capacity = paVar20->_M_allocated_capacity;
      aStack_448._8_8_ = plVar16[3];
      local_458 = (undefined1  [8])&aStack_448;
    }
    else {
      aStack_448._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_458 = (undefined1  [8])*plVar16;
    }
    dStack_450 = (double)plVar16[1];
    *plVar16 = (long)paVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_458);
    if (local_458 != (undefined1  [8])&aStack_448) {
      operator_delete((void *)local_458,aStack_448._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar4) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),3);
  makeSymbol<float>((Symbol *)local_458,local_4e0,
                    (local_4b8->in2).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar10 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x70),(string *)local_458);
  glu::VarType::operator=(&((pointer)(uVar10 + 0x70))->varType,(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])&aStack_448) {
    operator_delete((void *)local_458,aStack_448._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_458,local_4e0,
             (local_4b8->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar10 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_458);
  glu::VarType::operator=(&((pointer)(uVar10 + 0x38))->varType,(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])&aStack_448) {
    operator_delete((void *)local_458,aStack_448._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_458,local_4e0,
             (local_4b8->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar10 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_458);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])&aStack_448) {
    operator_delete((void *)local_458,aStack_448._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_458,local_4e0,
             (local_4b8->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar10 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_458);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])&aStack_448) {
    operator_delete((void *)local_458,aStack_448._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
  (*local_470->_vptr_Statement[2])(local_470,local_458);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
  std::ios_base::~ios_base(local_3e8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar4) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar23 = local_4e0;
  pSVar17 = ShaderExecUtil::createExecutor
                      ((local_4e0->m_ctx).renderContext,(local_4e0->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_458 = (undefined1  [8])
              (local_468->in0).
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  dStack_450 = (double)(local_468->in1).
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  aStack_448._M_allocated_capacity =
       (size_type)
       (local_468->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  aStack_448._8_8_ =
       (local_468->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar17->_vptr_ShaderExecutor[3])
            (pSVar17,((pPVar23->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar12 = (*pSVar17->_vptr_ShaderExecutor[2])(pSVar17);
  if ((char)iVar12 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar17->_vptr_ShaderExecutor[5])(pSVar17);
  (*pSVar17->_vptr_ShaderExecutor[6])(pSVar17,size & 0xffffffff,local_458);
  (*pSVar17->_vptr_ShaderExecutor[1])(pSVar17);
  pVVar8 = local_4b8;
  local_458 = (undefined1  [8])((ulong)local_458 & 0xffffffffffffff00);
  dStack_450 = INFINITY;
  aStack_448._M_allocated_capacity = 0xfff0000000000000;
  aStack_448._8_8_ = aStack_448._8_8_ & 0xffffffffffffff00;
  local_438 = INFINITY;
  DStack_430.basic.type = TYPE_INVALID;
  DStack_430.basic.precision = 0xfff00000;
  local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
  local_1a8._8_8_ = INFINITY;
  local_1a8._16_8_ = -INFINITY;
  local_1a8._24_8_ = local_1a8._24_8_ & 0xffffffffffffff00;
  local_188 = INFINITY;
  aStack_180.type = TYPE_INVALID;
  aStack_180.precision = 0xfff00000;
  local_4d8._0_4_ = local_4d8._0_4_ & 0xffffff00;
  local_4d0 = INFINITY;
  aStack_4c8._M_allocated_capacity = 0xfff0000000000000;
  local_4b0 = (undefined1  [8])((ulong)local_4b0 & 0xffffffffffffff00);
  uStack_4a8 = INFINITY;
  auStack_4a0._0_4_ = 0.0;
  auStack_4a0._4_4_ = -NAN;
  auStack_4a0._8_8_ = auStack_4a0._8_8_ & 0xffffffffffffff00;
  auStack_4a0._16_8_ = (_Base_ptr)0x7ff0000000000000;
  dStack_488 = -INFINITY;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2b8,
             (local_4b8->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_458);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2b8,
             (pVVar8->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<float>
            ((Environment *)&local_2b8,
             (pVVar8->in2).super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
             .m_ptr,(IVal *)local_4d8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b8,
             (pVVar8->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_2d8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2b8,
             (pVVar8->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_4b0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b8,
             (pVVar8->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_479);
  if (pVVar2 == local_478) {
LAB_00809d13:
    local_458 = (undefined1  [8])((pPVar23->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_450);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    fmt = &(pPVar23->m_ctx).floatFormat;
    local_280 = &pPVar23->m_status;
    local_288 = size + (size == 0);
    lVar25 = 0;
    lVar22 = 0;
    uVar24 = 0;
    local_478 = (pointer)0x0;
    local_460 = size;
    do {
      local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
      local_1a8._8_8_ = INFINITY;
      local_1a8._16_8_ = 0xfff0000000000000;
      local_1a8._24_8_ = local_1a8._24_8_ & 0xffffffffffffff00;
      local_188 = INFINITY;
      aStack_180 = (anon_struct_8_2_bfd9d0cb_for_basic)0xfff0000000000000;
      if ((uVar24 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_4e0->super_TestCase).super_TestNode.m_testCtx);
      }
      pIVar9 = local_468;
      pVVar2 = (local_468->in0).
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4d8._0_4_ = pVVar2[uVar24].m_data[0];
      local_4d8._4_4_ = pVVar2[uVar24].m_data[1];
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_4b0,fmt,(Vector<float,_2> *)local_4d8);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_458,fmt,(IVal *)local_4b0);
      pIVar18 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2b8,
                           (local_4b8->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar18->m_data[1].m_lo = local_438;
      pIVar18->m_data[1].m_hi = (double)DStack_430.basic;
      pIVar18->m_data[0].m_hi = (double)aStack_448._M_allocated_capacity;
      *(undefined8 *)(pIVar18->m_data + 1) = aStack_448._8_8_;
      pIVar18->m_data[0].m_hasNaN = local_458;
      pIVar18->m_data[0].m_lo = dStack_450;
      pVVar2 = (pIVar9->in1).
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4d8._0_4_ = pVVar2[uVar24].m_data[0];
      local_4d8._4_4_ = pVVar2[uVar24].m_data[1];
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_4b0,fmt,(Vector<float,_2> *)local_4d8);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_458,fmt,(IVal *)local_4b0);
      pIVar18 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2b8,
                           (local_4b8->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pVVar8 = local_4b8;
      pIVar18->m_data[1].m_lo = local_438;
      pIVar18->m_data[1].m_hi = (double)DStack_430.basic;
      pIVar18->m_data[0].m_hi = (double)aStack_448._M_allocated_capacity;
      *(undefined8 *)(pIVar18->m_data + 1) = aStack_448._8_8_;
      pIVar18->m_data[0].m_hasNaN = local_458;
      pIVar18->m_data[0].m_lo = dStack_450;
      fVar1 = (pIVar9->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar24];
      dVar6 = (double)fVar1;
      bVar11 = NAN(fVar1);
      local_458[0] = bVar11;
      dStack_450 = INFINITY;
      if (!bVar11) {
        dStack_450 = dVar6;
      }
      aStack_448._M_allocated_capacity = (size_type)-INFINITY;
      if (!bVar11) {
        aStack_448._M_allocated_capacity = (size_type)dVar6;
      }
      tcu::FloatFormat::roundOut((Interval *)local_4d8,fmt,(Interval *)local_458,false);
      tcu::FloatFormat::convert((Interval *)local_4b0,fmt,(Interval *)local_4d8);
      pIVar19 = Environment::lookup<float>
                          ((Environment *)&local_2b8,
                           (pVVar8->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pIVar19->m_hi = (double)auStack_4a0._0_8_;
      pIVar19->m_hasNaN = local_4b0;
      pIVar19->m_lo = uStack_4a8;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2b8,
                 (pVVar8->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_438 = (pPVar23->m_ctx).floatFormat.m_maxValue;
      local_458 = *(undefined1 (*) [8])fmt;
      dStack_450 = *(double *)&(pPVar23->m_ctx).floatFormat.m_fractionBits;
      aStack_448._M_allocated_capacity = *(undefined8 *)&(pPVar23->m_ctx).floatFormat.m_hasInf;
      aStack_448._8_8_ = *(undefined8 *)&(pPVar23->m_ctx).floatFormat.m_exactPrecision;
      DStack_430.basic.type = (local_4e0->m_ctx).precision;
      local_420 = 0;
      DStack_430._8_8_ = &local_2b8;
      (*local_470->_vptr_Statement[3])(local_470,local_458);
      pIVar18 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2b8,
                           (pVVar8->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_458,&local_278,pIVar18);
      local_188 = local_438;
      aStack_180 = DStack_430.basic;
      local_1a8._16_8_ = aStack_448._M_allocated_capacity;
      local_1a8._24_8_ = aStack_448._8_8_;
      local_1a8._0_8_ = local_458;
      local_1a8._8_8_ = dStack_450;
      bVar11 = contains<tcu::Vector<float,2>>
                         ((IVal *)local_1a8,
                          (Vector<float,_2> *)
                          ((long)(local_250.out0.
                                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22));
      local_458 = (undefined1  [8])&aStack_448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_458,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(local_280,bVar11,(string *)local_458);
      if (local_458 != (undefined1  [8])&aStack_448) {
        operator_delete((void *)local_458,aStack_448._M_allocated_capacity + 1);
      }
      if (!bVar11) {
        uVar13 = (int)local_478 + 1;
        local_478 = (pointer)(ulong)uVar13;
        if ((int)uVar13 < 0x65) {
          local_458 = (undefined1  [8])((local_4e0->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
          pIVar9 = local_468;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\t",1);
          pVVar3 = (local_4b8->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                   .m_ptr;
          pVVar21 = (Vector<float,_2> *)auStack_4a0;
          pcVar4 = (pVVar3->m_name)._M_dataplus._M_p;
          local_4b0 = (undefined1  [8])pVVar21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4b0,pcVar4,pcVar4 + (pVVar3->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_450,(char *)local_4b0,(long)uStack_4a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_4d8,(BuiltinPrecisionTests *)&local_278,
                     (FloatFormat *)
                     ((long)((pIVar9->in0).
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22),pVVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_450,(char *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_),
                     (long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_) != &aStack_4c8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_),
                            aStack_4c8._M_allocated_capacity + 1);
          }
          if (local_4b0 != (undefined1  [8])auStack_4a0) {
            operator_delete((void *)local_4b0,(ulong)(auStack_4a0._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\t",1);
          pVVar3 = (local_4b8->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                   .m_ptr;
          pVVar21 = (Vector<float,_2> *)auStack_4a0;
          pcVar4 = (pVVar3->m_name)._M_dataplus._M_p;
          local_4b0 = (undefined1  [8])pVVar21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4b0,pcVar4,pcVar4 + (pVVar3->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_450,(char *)local_4b0,(long)uStack_4a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_4d8,(BuiltinPrecisionTests *)&local_278,
                     (FloatFormat *)
                     ((long)((pIVar9->in1).
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22),pVVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_450,(char *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_),
                     (long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_) != &aStack_4c8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_),
                            aStack_4c8._M_allocated_capacity + 1);
          }
          if (local_4b0 != (undefined1  [8])auStack_4a0) {
            operator_delete((void *)local_4b0,(ulong)(auStack_4a0._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\t",1);
          pVVar5 = (local_4b8->in2).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_4b0 = (undefined1  [8])auStack_4a0;
          pcVar4 = (pVVar5->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4b0,pcVar4,pcVar4 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_450,(char *)local_4b0,(long)uStack_4a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," = ",3);
          valueToString<float>
                    ((string *)local_4d8,&local_278,
                     (float *)((long)(pIVar9->in2).super__Vector_base<float,_std::allocator<float>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar25));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_450,(char *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_),
                     (long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_) != &aStack_4c8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_),
                            aStack_4c8._M_allocated_capacity + 1);
          }
          if (local_4b0 != (undefined1  [8])auStack_4a0) {
            operator_delete((void *)local_4b0,(ulong)(auStack_4a0._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\t",1);
          pVVar3 = (local_4b8->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                   .m_ptr;
          pIVar18 = (IVal *)auStack_4a0;
          pcVar4 = (pVVar3->m_name)._M_dataplus._M_p;
          local_4b0 = (undefined1  [8])pIVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4b0,pcVar4,pcVar4 + (pVVar3->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_450,(char *)local_4b0,(long)uStack_4a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_4d8,(BuiltinPrecisionTests *)&local_278,
                     (FloatFormat *)
                     ((long)(local_250.out0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22),
                     (Vector<float,_2> *)pIVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_450,(char *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_),
                     (long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_450,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,2>>
                    (&local_2d8,(BuiltinPrecisionTests *)&local_278,(FloatFormat *)local_1a8,pIVar18
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_450,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_) != &aStack_4c8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_),
                            aStack_4c8._M_allocated_capacity + 1);
          }
          if (local_4b0 != (undefined1  [8])auStack_4a0) {
            operator_delete((void *)local_4b0,(ulong)(auStack_4a0._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_450);
          std::ios_base::~ios_base(local_3e0);
        }
      }
      pPVar7 = local_4e0;
      uVar24 = uVar24 + 1;
      lVar22 = lVar22 + 8;
      lVar25 = lVar25 + 4;
    } while (local_288 != uVar24);
    iVar12 = (int)local_478;
    if (iVar12 < 0x65) {
      pPVar23 = local_4e0;
      if (iVar12 == 0) goto LAB_00809d13;
    }
    else {
      local_458 = (undefined1  [8])((local_4e0->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_450,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_450);
      std::ios_base::~ios_base(local_3e0);
    }
    local_458 = (undefined1  [8])((pPVar7->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
    std::ostream::operator<<((ostringstream *)&dStack_450,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_450);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_450);
  std::ios_base::~ios_base(local_3e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}